

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_set_composite_item(AMQP_VALUE value,uint32_t index,AMQP_VALUE item_value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1c8b;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1c8b;
    }
    pcVar4 = "NULL value";
    iVar3 = 0x1c8a;
  }
  else if ((value->type & ~AMQP_TYPE_NULL) == AMQP_TYPE_DESCRIBED) {
    iVar1 = amqpvalue_set_list_item((value->value).described_value.value,index,item_value);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1c9b;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1c9b;
    }
    pcVar4 = "amqpvalue_set_list_item failed for composite item";
    iVar3 = 0x1c9a;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1c94;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1c94;
    }
    pcVar4 = "Attempt to set composite item on a non-composite type";
    iVar3 = 0x1c93;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_set_composite_item",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int amqpvalue_set_composite_item(AMQP_VALUE value, uint32_t index, AMQP_VALUE item_value)
{
    int result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if ((value_data->type != AMQP_TYPE_COMPOSITE) &&
            (value_data->type != AMQP_TYPE_DESCRIBED))
        {
            LogError("Attempt to set composite item on a non-composite type");
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_list_item(value_data->value.described_value.value, index, item_value) != 0)
            {
                LogError("amqpvalue_set_list_item failed for composite item");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    return result;
}